

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int PickBestIntra4(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  int iVar2;
  int16_t *levels;
  VP8ModeScore *in_RSI;
  VP8EncIterator *in_RDI;
  int16_t tmp_levels [16];
  VP8ModeScore rd_tmp;
  uint8_t *tmp_dst;
  uint8_t *best_block;
  uint16_t *mode_costs;
  uint8_t *src;
  int best_mode;
  int mode;
  VP8ModeScore rd_i4;
  int kNumBlocks;
  VP8ModeScore rd_best;
  int total_header_bits;
  uint8_t *best_blocks;
  uint8_t *src0;
  int tlambda;
  int lambda;
  VP8SegmentInfo *dqm;
  VP8Encoder *enc;
  undefined4 in_stack_fffffffffffff510;
  undefined4 in_stack_fffffffffffff514;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 local_ad0;
  long local_ac8;
  long local_ac0;
  VP8EncIterator *it_00;
  long local_aa8;
  int in_stack_fffffffffffff564;
  uint8_t *in_stack_fffffffffffff568;
  uint8_t *in_stack_fffffffffffff570;
  int16_t *in_stack_fffffffffffff578;
  VP8EncIterator *in_stack_fffffffffffff580;
  uint8_t *local_758;
  uint8_t *local_750;
  uint16_t *local_748;
  uint8_t *local_740;
  int local_738;
  int local_734;
  VP8ModeScore local_730;
  undefined4 local_3bc;
  VP8ModeScore local_3b8;
  int local_44;
  uint8_t *local_40;
  uint8_t *local_38;
  int local_30;
  int local_2c;
  VP8SegmentInfo *local_28;
  VP8Encoder *local_20;
  VP8ModeScore *local_18;
  VP8EncIterator *local_10;
  int local_4;
  
  local_20 = in_RDI->enc_;
  local_28 = local_20->dqm_ + (*(byte *)in_RDI->mb_ >> 5 & 3);
  local_2c = local_28->lambda_i4_;
  local_30 = local_28->tlambda_;
  local_38 = in_RDI->yuv_in_;
  local_40 = in_RDI->yuv_out2_;
  local_44 = 0;
  if (local_20->max_i4_header_bits_ == 0) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    InitScore(&local_3b8);
    local_3b8.H = 0xd3;
    SetRDScore(local_28->lambda_mode_,&local_3b8);
    VP8IteratorStartI4((VP8EncIterator *)
                       CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510));
    do {
      local_3bc = 1;
      local_738 = -1;
      local_740 = local_38 + (int)(uint)VP8Scan[local_10->i4_];
      local_748 = GetCostModeI4(local_10,local_18->modes_i4);
      local_750 = local_40 + (int)(uint)VP8Scan[local_10->i4_];
      local_758 = local_10->yuv_p_ + 0x688;
      InitScore(&local_730);
      MakeIntra4Preds((VP8EncIterator *)0x1758c1);
      for (local_734 = 0; local_734 < 10; local_734 = local_734 + 1) {
        ReconstructIntra4(in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                          in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                          in_stack_fffffffffffff564);
        iVar1 = (*VP8SSE4x4)(local_740,local_758);
        local_ac8 = (long)iVar1;
        if (local_30 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = local_30;
          iVar2 = (*VP8TDisto4x4)(local_740,local_758,kWeightY);
          iVar1 = iVar1 * iVar2 + 0x80 >> 8;
        }
        local_ac0 = (long)iVar1;
        levels = (int16_t *)(ulong)local_748[local_734];
        if ((local_734 < 1) || (iVar1 = IsFlat_C((int16_t *)&local_ae8,1,3), iVar1 == 0)) {
          it_00 = (VP8EncIterator *)0x0;
        }
        else {
          it_00 = (VP8EncIterator *)0x8c;
        }
        SetRDScore(local_2c,(VP8ModeScore *)&local_ac8);
        if ((local_738 < 0) || (local_aa8 < local_730.score)) {
          VP8GetCostLuma4(it_00,levels);
          SetRDScore(local_2c,(VP8ModeScore *)&local_ac8);
          if ((local_738 < 0) || (local_aa8 < local_730.score)) {
            CopyScore(&local_730,(VP8ModeScore *)&local_ac8);
            local_738 = local_734;
            SwapPtr(&local_758,&local_750);
            iVar1 = local_10->i4_;
            *(undefined8 *)local_3b8.y_ac_levels[iVar1] = local_ae8;
            *(undefined8 *)(local_3b8.y_ac_levels[iVar1] + 4) = local_ae0;
            *(undefined8 *)(local_3b8.y_ac_levels[iVar1] + 8) = local_ad8;
            *(undefined8 *)(local_3b8.y_ac_levels[iVar1] + 0xc) = local_ad0;
          }
        }
      }
      SetRDScore(local_28->lambda_mode_,&local_730);
      AddScore(&local_3b8,&local_730);
      if (local_18->score <= local_3b8.score) {
        return 0;
      }
      local_44 = (int)local_730.H + local_44;
      if (local_20->max_i4_header_bits_ < local_44) {
        return 0;
      }
      if (local_750 != local_40 + (int)(uint)VP8Scan[local_10->i4_]) {
        (*VP8Copy4x4)(local_750,local_40 + (int)(uint)VP8Scan[local_10->i4_]);
      }
      local_18->modes_i4[local_10->i4_] = (uint8_t)local_738;
      local_10->left_nz_[local_10->i4_ >> 2] = (uint)(local_730.nz != 0);
      local_10->top_nz_[(int)(local_10->i4_ & 3)] = (uint)(local_730.nz != 0);
      iVar1 = VP8IteratorRotateI4(local_10,local_40);
    } while (iVar1 != 0);
    CopyScore(local_18,&local_3b8);
    VP8SetIntra4Mode(local_10,local_18->modes_i4);
    SwapOut((VP8EncIterator *)0x175cda);
    memcpy(local_18->y_ac_levels,local_3b8.y_ac_levels,0x200);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int PickBestIntra4(VP8EncIterator* WEBP_RESTRICT const it,
                          VP8ModeScore* WEBP_RESTRICT const rd) {
  const VP8Encoder* const enc = it->enc_;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  const int lambda = dqm->lambda_i4_;
  const int tlambda = dqm->tlambda_;
  const uint8_t* const src0 = it->yuv_in_ + Y_OFF_ENC;
  uint8_t* const best_blocks = it->yuv_out2_ + Y_OFF_ENC;
  int total_header_bits = 0;
  VP8ModeScore rd_best;

  if (enc->max_i4_header_bits_ == 0) {
    return 0;
  }

  InitScore(&rd_best);
  rd_best.H = 211;  // '211' is the value of VP8BitCost(0, 145)
  SetRDScore(dqm->lambda_mode_, &rd_best);
  VP8IteratorStartI4(it);
  do {
    const int kNumBlocks = 1;
    VP8ModeScore rd_i4;
    int mode;
    int best_mode = -1;
    const uint8_t* const src = src0 + VP8Scan[it->i4_];
    const uint16_t* const mode_costs = GetCostModeI4(it, rd->modes_i4);
    uint8_t* best_block = best_blocks + VP8Scan[it->i4_];
    uint8_t* tmp_dst = it->yuv_p_ + I4TMP;    // scratch buffer.

    InitScore(&rd_i4);
    MakeIntra4Preds(it);
    for (mode = 0; mode < NUM_BMODES; ++mode) {
      VP8ModeScore rd_tmp;
      int16_t tmp_levels[16];

      // Reconstruct
      rd_tmp.nz =
          ReconstructIntra4(it, tmp_levels, src, tmp_dst, mode) << it->i4_;

      // Compute RD-score
      rd_tmp.D = VP8SSE4x4(src, tmp_dst);
      rd_tmp.SD =
          tlambda ? MULT_8B(tlambda, VP8TDisto4x4(src, tmp_dst, kWeightY))
                  : 0;
      rd_tmp.H = mode_costs[mode];

      // Add flatness penalty, to avoid flat area to be mispredicted
      // by a complex mode.
      if (mode > 0 && IsFlat(tmp_levels, kNumBlocks, FLATNESS_LIMIT_I4)) {
        rd_tmp.R = FLATNESS_PENALTY * kNumBlocks;
      } else {
        rd_tmp.R = 0;
      }

      // early-out check
      SetRDScore(lambda, &rd_tmp);
      if (best_mode >= 0 && rd_tmp.score >= rd_i4.score) continue;

      // finish computing score
      rd_tmp.R += VP8GetCostLuma4(it, tmp_levels);
      SetRDScore(lambda, &rd_tmp);

      if (best_mode < 0 || rd_tmp.score < rd_i4.score) {
        CopyScore(&rd_i4, &rd_tmp);
        best_mode = mode;
        SwapPtr(&tmp_dst, &best_block);
        memcpy(rd_best.y_ac_levels[it->i4_], tmp_levels,
               sizeof(rd_best.y_ac_levels[it->i4_]));
      }
    }
    SetRDScore(dqm->lambda_mode_, &rd_i4);
    AddScore(&rd_best, &rd_i4);
    if (rd_best.score >= rd->score) {
      return 0;
    }
    total_header_bits += (int)rd_i4.H;   // <- equal to mode_costs[best_mode];
    if (total_header_bits > enc->max_i4_header_bits_) {
      return 0;
    }
    // Copy selected samples if not in the right place already.
    if (best_block != best_blocks + VP8Scan[it->i4_]) {
      VP8Copy4x4(best_block, best_blocks + VP8Scan[it->i4_]);
    }
    rd->modes_i4[it->i4_] = best_mode;
    it->top_nz_[it->i4_ & 3] = it->left_nz_[it->i4_ >> 2] = (rd_i4.nz ? 1 : 0);
  } while (VP8IteratorRotateI4(it, best_blocks));

  // finalize state
  CopyScore(rd, &rd_best);
  VP8SetIntra4Mode(it, rd->modes_i4);
  SwapOut(it);
  memcpy(rd->y_ac_levels, rd_best.y_ac_levels, sizeof(rd->y_ac_levels));
  return 1;   // select intra4x4 over intra16x16
}